

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O3

void __thiscall
rtosc::MidiMapperRT::handleCC(MidiMapperRT *this,int par,int val,char chan,bool isNrpn)

{
  ulong uVar1;
  MidiMapperStorage *this_00;
  long lVar2;
  char cVar3;
  bool bVar4;
  ulong uVar5;
  uint ID;
  undefined7 in_register_00000081;
  char msg [1024];
  char *local_450;
  _Any_data local_448;
  code *local_438;
  char local_428 [1024];
  
  cVar3 = '\x01';
  if ('\x01' < chan) {
    cVar3 = chan;
  }
  ID = (int)CONCAT71(in_register_00000081,isNrpn) * 0x40000 + par +
       (uint)(cVar3 - 1U & 0xf) * 0x4000;
  this_00 = this->storage;
  if (this_00 == (MidiMapperStorage *)0x0) {
LAB_00114140:
    if ((this->pending).vals[0] == ID) {
LAB_00114144:
      if (this_00 == (MidiMapperStorage *)0x0) {
        return;
      }
      goto LAB_0011414d;
    }
    uVar5 = 0xffffffffffffffff;
    do {
      if (uVar5 == 0x1e) goto LAB_00114172;
      uVar1 = uVar5 + 1;
      lVar2 = uVar5 + 2;
      uVar5 = uVar1;
    } while ((this->pending).vals[lVar2] != ID);
    if (uVar1 < 0x1f) goto LAB_00114144;
LAB_00114172:
    bVar4 = this->watchSize != 0;
    if (this_00 == (MidiMapperStorage *)0x0) goto LAB_0011419b;
  }
  else {
    std::function<void_(const_char_*)>::function
              ((function<void_(const_char_*)> *)&local_448,&this->backend);
    bVar4 = MidiMapperStorage::handleCC(this_00,ID,val,(write_cb *)&local_448);
    if (!bVar4) goto LAB_00114140;
LAB_0011414d:
    bVar4 = false;
  }
  if (local_438 != (code *)0x0) {
    (*local_438)(&local_448,&local_448,__destroy_functor);
  }
LAB_0011419b:
  if (bVar4) {
    this->watchSize = this->watchSize - 1;
    PendingQueue::insert(&this->pending,ID);
    rtosc_message(local_428,0x400,"/midi-use-CC","i",(ulong)ID);
    local_450 = local_428;
    if ((this->frontend).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->frontend)._M_invoker)((_Any_data *)&this->frontend,&local_450);
  }
  return;
}

Assistant:

void MidiMapperRT::handleCC(int par, int val, char chan, bool isNrpn) {
    
    if(chan<1) chan=1;
    int ID = (isNrpn<<18) + (((chan-1)&0x0f)<<14) + par;
    //printf("handling CC(%d,%d){%d,%d,%d}\n", ID, val, (int)storage, pending.has(ID), watchSize);
    if((!storage || !storage->handleCC(ID, val, backend)) && !pending.has(ID) && watchSize) {
        watchSize--;
        pending.insert(ID);
        char msg[1024];
        rtosc_message(msg, 1024, "/midi-use-CC", "i", ID);
        frontend(msg);
    }
}